

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

void __thiscall
duckdb_shell::ShellState::UTF8WidthPrint
          (ShellState *this,FILE *pOut,idx_t w,string *str,bool right_align)

{
  char *__s;
  uint uVar1;
  ulong in_RAX;
  size_t len;
  ulong uVar2;
  int iVar3;
  int max_width;
  int n;
  undefined8 uStack_28;
  
  __s = (str->_M_dataplus)._M_p;
  uStack_28 = in_RAX;
  len = strlen(__s);
  max_width = (int)w;
  uVar1 = linenoiseGetRenderPosition(__s,len,max_width,(int *)((long)&uStack_28 + 4));
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 0) {
    uStack_28 = uStack_28 & 0xffffffff;
    iVar3 = 0;
    for (uVar2 = 0; __s[uVar2] != '\0'; uVar2 = uVar2 + 1) {
      iVar3 = iVar3 + 1;
      uStack_28 = CONCAT44(iVar3,(undefined4)uStack_28);
      if (iVar3 == max_width) {
        uVar2 = uVar2 + 1;
        goto LAB_001e0743;
      }
    }
  }
  else {
    iVar3 = uStack_28._4_4_;
  }
  uVar1 = max_width - iVar3;
  if (uVar1 == 0 || max_width < iVar3) {
LAB_001e0743:
    fprintf((FILE *)pOut,"%.*s",uVar2 & 0xffffffff,__s);
  }
  else if (right_align) {
    fprintf((FILE *)pOut,"%*s%s",(ulong)uVar1,anon_var_dwarf_4b71df5 + 9,__s);
  }
  else {
    fprintf((FILE *)pOut,"%s%*s",__s,(ulong)uVar1,anon_var_dwarf_4b71df5 + 9);
  }
  return;
}

Assistant:

void ShellState::UTF8WidthPrint(FILE *pOut, idx_t w, const string &str, bool right_align) {
	auto zUtf = str.c_str();
	int i;
	int n;
	int aw = w < 0 ? -w : w;
#ifdef HAVE_LINENOISE
	i = linenoiseGetRenderPosition(zUtf, strlen(zUtf), aw, &n);
	if (i < 0)
#endif
		for (i = n = 0; zUtf[i]; i++) {
			if ((zUtf[i] & 0xc0) != 0x80) {
				n++;
				if (n == aw) {
					do {
						i++;
					} while ((zUtf[i] & 0xc0) == 0x80);
					break;
				}
			}
		}
	if (n >= aw) {
		utf8_printf(pOut, "%.*s", i, zUtf);
	} else if (right_align) {
		utf8_printf(pOut, "%*s%s", aw - n, "", zUtf);
	} else {
		utf8_printf(pOut, "%s%*s", zUtf, aw - n, "");
	}
}